

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::GetSCCAnalysis
          (MessageSCCAnalyzer *this,SCC *scc)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  MessageAnalysis MVar5;
  pointer prVar6;
  FileDescriptor *file;
  Descriptor *pDVar7;
  const_reference ppDVar8;
  FieldDescriptor *this_00;
  ulong uVar9;
  FieldOptions *this_01;
  Descriptor *descriptor_00;
  slot_type *scc_00;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>_>
  pMVar10;
  MessageAnalysis analysis;
  SCC *child;
  FieldDescriptor *field;
  int j;
  Descriptor *descriptor;
  size_t i;
  undefined1 auStack_40 [3];
  MessageAnalysis result;
  undefined1 local_30 [8];
  iterator it;
  SCC *scc_local;
  MessageSCCAnalyzer *this_local;
  
  it.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)scc;
  _local_30 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
              ::find<google::protobuf::compiler::SCC_const*>
                        ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                          *)&this->analysis_cache_,
                         (key_arg<const_google::protobuf::compiler::SCC_*> *)&it.field_1.slot_);
  _auStack_40 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                       *)&this->analysis_cache_);
  bVar2 = absl::lts_20240722::container_internal::operator!=
                    ((iterator *)local_30,(iterator *)auStack_40);
  if (bVar2) {
    prVar6 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::iterator::operator->((iterator *)local_30);
    this_local._3_1_ = (prVar6->second).is_recursive;
    this_local._4_1_ = (prVar6->second).contains_cord;
    this_local._5_1_ = (prVar6->second).contains_extension;
    this_local._6_1_ = (prVar6->second).contains_required;
    this_local._7_1_ = (prVar6->second).contains_weak;
  }
  else {
    MessageAnalysis::MessageAnalysis((MessageAnalysis *)((long)&i + 3));
    file = SCC::GetFile((SCC *)it.field_1.slot_);
    bVar2 = UsingImplicitWeakFields(file,&this->options_);
    if (bVar2) {
      i._7_1_ = 1;
    }
    for (descriptor = (Descriptor *)0x0;
        pDVar7 = (Descriptor *)
                 std::
                 vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::size((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         *)it.field_1.slot_), descriptor < pDVar7; descriptor = descriptor + 1) {
      ppDVar8 = std::
                vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::operator[]((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                              *)it.field_1.slot_,(size_type)descriptor);
      pDVar7 = *ppDVar8;
      iVar3 = Descriptor::extension_range_count(pDVar7);
      if (0 < iVar3) {
        i._3_3_ = CONCAT12(1,i._3_2_);
      }
      for (field._4_4_ = 0; iVar3 = Descriptor::field_count(pDVar7), field._4_4_ < iVar3;
          field._4_4_ = field._4_4_ + 1) {
        this_00 = Descriptor::field(pDVar7,field._4_4_);
        uVar9 = google::protobuf::FieldDescriptor::is_required();
        if ((uVar9 & 1) != 0) {
          i._3_4_ = CONCAT13(1,i._3_3_);
        }
        this_01 = FieldDescriptor::options(this_00);
        bVar2 = FieldOptions::weak(this_01);
        if (bVar2) {
          i._7_1_ = 1;
        }
        TVar4 = FieldDescriptor::type(this_00);
        if (TVar4 == TYPE_STRING) {
LAB_002a3059:
          iVar3 = google::protobuf::FieldDescriptor::cpp_string_type();
          if (iVar3 == 2) {
            i._3_2_ = CONCAT11(1,i._3_1_);
          }
        }
        else if (TVar4 - TYPE_GROUP < 2) {
          descriptor_00 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
          scc_00 = (slot_type *)
                   SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                   GetSCC(&this->analyzer_,descriptor_00);
          if (scc_00 == it.field_1.slot_) {
            i._3_4_ = CONCAT31(i._4_3_,1);
          }
          else {
            MVar5 = GetSCCAnalysis(this,(SCC *)&scc_00->value);
            uVar1 = i._3_4_;
            i._3_2_ = CONCAT11((i._3_4_ & 0x100) != 0 || ((uint5)MVar5 & 0x100) != 0,i._3_1_);
            i._6_1_ = SUB41(uVar1,3);
            i._3_3_ = CONCAT12((uVar1 & 0x10000) != 0 || ((uint5)MVar5 & 0x10000) != 0,i._3_2_);
            bVar2 = ShouldIgnoreRequiredFieldCheck(this_00,&this->options_);
            if (!bVar2) {
              i._3_4_ = CONCAT13((i._3_4_ & 0x1000000) != 0 || ((uint5)MVar5 & 0x1000000) != 0,
                                 i._3_3_);
            }
            i._7_1_ = (i._7_1_ & 1) != 0 || ((uint5)MVar5 & 0x100000000) != 0;
          }
        }
        else if (TVar4 == TYPE_BYTES) goto LAB_002a3059;
      }
    }
    pMVar10 = absl::lts_20240722::container_internal::
              raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
              ::
              operator[]<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>>
                        ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                          *)&this->analysis_cache_,
                         (key_arg<const_google::protobuf::compiler::SCC_*> *)&it.field_1.slot_);
    pMVar10->is_recursive = (bool)i._3_1_;
    pMVar10->contains_cord = (bool)i._4_1_;
    pMVar10->contains_extension = (bool)i._5_1_;
    pMVar10->contains_required = (bool)i._6_1_;
    pMVar10->contains_weak = (bool)i._7_1_;
    this_local._3_1_ = pMVar10->is_recursive;
    this_local._4_1_ = pMVar10->contains_cord;
    this_local._5_1_ = pMVar10->contains_extension;
    this_local._6_1_ = pMVar10->contains_required;
    this_local._7_1_ = pMVar10->contains_weak;
  }
  MVar5.contains_weak = this_local._7_1_;
  MVar5.is_recursive = (bool)this_local._3_1_;
  MVar5.contains_cord = (bool)this_local._4_1_;
  MVar5.contains_extension = (bool)this_local._5_1_;
  MVar5.contains_required = (bool)this_local._6_1_;
  return MVar5;
}

Assistant:

MessageAnalysis MessageSCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  auto it = analysis_cache_.find(scc);
  if (it != analysis_cache_.end()) return it->second;

  MessageAnalysis result;
  if (UsingImplicitWeakFields(scc->GetFile(), options_)) {
    result.contains_weak = true;
  }
  for (size_t i = 0; i < scc->descriptors.size(); ++i) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int j = 0; j < descriptor->field_count(); j++) {
      const FieldDescriptor* field = descriptor->field(j);
      if (field->is_required()) {
        result.contains_required = true;
      }
      if (field->options().weak()) {
        result.contains_weak = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->cpp_string_type() ==
              FieldDescriptor::CppStringType::kCord) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = analyzer_.GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
            result.contains_weak |= analysis.contains_weak;
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = std::move(result);
}